

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::FreeBuffersResponse>::Deferred
          (Deferred<perfetto::protos::gen::FreeBuffersResponse> *this,
          function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)>
          *callback)

{
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)> local_58;
  function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> local_38;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)> *local_18;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)>
  *callback_local;
  Deferred<perfetto::protos::gen::FreeBuffersResponse> *this_local;
  
  local_18 = callback;
  callback_local =
       (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)> *)
       this;
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::function
            (&local_38,(nullptr_t)0x0);
  DeferredBase::DeferredBase(&this->super_DeferredBase,&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::~function(&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)>::
  function(&local_58,callback);
  Bind(this,&local_58);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>)>::
  ~function(&local_58);
  return;
}

Assistant:

explicit Deferred(std::function<void(AsyncResult<T>)> callback = nullptr) {
    Bind(std::move(callback));
  }